

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImRect ImGui::GetPopupAllowedExtentRect(ImGuiWindow_conflict *window)

{
  ImGuiPlatformMonitor *pIVar1;
  long lVar2;
  float fVar3;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar10;
  ImRect IVar11;
  ImVec2 IVar4;
  ImVec2 IVar9;
  
  lVar2 = (long)window->ViewportAllowPlatformMonitorExtend;
  if (lVar2 < 0) {
    IVar4 = (window->Viewport->super_ImGuiViewport).Pos;
    IVar9 = (window->Viewport->super_ImGuiViewport).Size;
  }
  else {
    if ((GImGui->PlatformIO).Monitors.Size <= window->ViewportAllowPlatformMonitorExtend) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                    ,0x706,
                    "T &ImVector<ImGuiPlatformMonitor>::operator[](int) [T = ImGuiPlatformMonitor]")
      ;
    }
    pIVar1 = (GImGui->PlatformIO).Monitors.Data;
    IVar4 = pIVar1[lVar2].WorkPos;
    IVar9 = pIVar1[lVar2].WorkSize;
  }
  fVar3 = IVar4.x;
  fVar8 = IVar9.x + fVar3;
  fVar5 = IVar4.y;
  fVar10 = IVar9.y + fVar5;
  IVar4 = (GImGui->Style).DisplaySafeAreaPadding;
  fVar6 = IVar4.x;
  fVar7 = IVar4.y;
  fVar6 = (float)((uint)-fVar6 & -(uint)(fVar6 + fVar6 < fVar8 - fVar3));
  fVar7 = (float)((uint)-fVar7 & -(uint)(fVar7 + fVar7 < fVar10 - fVar5));
  IVar11.Min.x = fVar3 - fVar6;
  IVar11.Min.y = fVar5 - fVar7;
  IVar11.Max.x = fVar6 + fVar8;
  IVar11.Max.y = fVar7 + fVar10;
  return IVar11;
}

Assistant:

ImRect ImGui::GetPopupAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImRect r_screen;
    if (window->ViewportAllowPlatformMonitorExtend >= 0)
    {
        // Extent with be in the frame of reference of the given viewport (so Min is likely to be negative here)
        const ImGuiPlatformMonitor& monitor = g.PlatformIO.Monitors[window->ViewportAllowPlatformMonitorExtend];
        r_screen.Min = monitor.WorkPos;
        r_screen.Max = monitor.WorkPos + monitor.WorkSize;
    }
    else
    {
        // Use the full viewport area (not work area) for popups
        r_screen = window->Viewport->GetMainRect();
    }
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}